

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O2

void FastPForLib::fastpackwithoutmask(uint64_t *in,uint32_t *out,uint32_t bit)

{
  switch(bit) {
  case 0:
    __fastpackwithoutmask0(in,out);
    return;
  case 1:
    __fastpackwithoutmask1(in,out);
    return;
  case 2:
    __fastpackwithoutmask2(in,out);
    return;
  case 3:
    __fastpackwithoutmask3(in,out);
    return;
  case 4:
    __fastpackwithoutmask4(in,out);
    return;
  case 5:
    __fastpackwithoutmask5(in,out);
    return;
  case 6:
    __fastpackwithoutmask6(in,out);
    return;
  case 7:
    __fastpackwithoutmask7(in,out);
    return;
  case 8:
    __fastpackwithoutmask8(in,out);
    return;
  case 9:
    __fastpackwithoutmask9(in,out);
    return;
  case 10:
    __fastpackwithoutmask10(in,out);
    return;
  case 0xb:
    __fastpackwithoutmask11(in,out);
    return;
  case 0xc:
    __fastpackwithoutmask12(in,out);
    return;
  case 0xd:
    __fastpackwithoutmask13(in,out);
    return;
  case 0xe:
    __fastpackwithoutmask14(in,out);
    return;
  case 0xf:
    __fastpackwithoutmask15(in,out);
    return;
  case 0x10:
    __fastpackwithoutmask16(in,out);
    return;
  case 0x11:
    __fastpackwithoutmask17(in,out);
    return;
  case 0x12:
    __fastpackwithoutmask18(in,out);
    return;
  case 0x13:
    __fastpackwithoutmask19(in,out);
    return;
  case 0x14:
    __fastpackwithoutmask20(in,out);
    return;
  case 0x15:
    __fastpackwithoutmask21(in,out);
    return;
  case 0x16:
    __fastpackwithoutmask22(in,out);
    return;
  case 0x17:
    __fastpackwithoutmask23(in,out);
    return;
  case 0x18:
    __fastpackwithoutmask24(in,out);
    return;
  case 0x19:
    __fastpackwithoutmask25(in,out);
    return;
  case 0x1a:
    __fastpackwithoutmask26(in,out);
    return;
  case 0x1b:
    __fastpackwithoutmask27(in,out);
    return;
  case 0x1c:
    __fastpackwithoutmask28(in,out);
    return;
  case 0x1d:
    __fastpackwithoutmask29(in,out);
    return;
  case 0x1e:
    __fastpackwithoutmask30(in,out);
    return;
  case 0x1f:
    __fastpackwithoutmask31(in,out);
    return;
  case 0x20:
    __fastpackwithoutmask32(in,out);
    return;
  case 0x21:
    __fastpackwithoutmask33(in,out);
    return;
  case 0x22:
    __fastpackwithoutmask34(in,out);
    return;
  case 0x23:
    __fastpackwithoutmask35(in,out);
    return;
  case 0x24:
    __fastpackwithoutmask36(in,out);
    return;
  case 0x25:
    __fastpackwithoutmask37(in,out);
    return;
  case 0x26:
    __fastpackwithoutmask38(in,out);
    return;
  case 0x27:
    __fastpackwithoutmask39(in,out);
    return;
  case 0x28:
    __fastpackwithoutmask40(in,out);
    return;
  case 0x29:
    __fastpackwithoutmask41(in,out);
    return;
  case 0x2a:
    __fastpackwithoutmask42(in,out);
    return;
  case 0x2b:
    __fastpackwithoutmask43(in,out);
    return;
  case 0x2c:
    __fastpackwithoutmask44(in,out);
    return;
  case 0x2d:
    __fastpackwithoutmask45(in,out);
    return;
  case 0x2e:
    __fastpackwithoutmask46(in,out);
    return;
  case 0x2f:
    __fastpackwithoutmask47(in,out);
    return;
  case 0x30:
    __fastpackwithoutmask48(in,out);
    return;
  case 0x31:
    __fastpackwithoutmask49(in,out);
    return;
  case 0x32:
    __fastpackwithoutmask50(in,out);
    return;
  case 0x33:
    __fastpackwithoutmask51(in,out);
    return;
  case 0x34:
    __fastpackwithoutmask52(in,out);
    return;
  case 0x35:
    __fastpackwithoutmask53(in,out);
    return;
  case 0x36:
    __fastpackwithoutmask54(in,out);
    return;
  case 0x37:
    __fastpackwithoutmask55(in,out);
    return;
  case 0x38:
    __fastpackwithoutmask56(in,out);
    return;
  case 0x39:
    __fastpackwithoutmask57(in,out);
    return;
  case 0x3a:
    __fastpackwithoutmask58(in,out);
    return;
  case 0x3b:
    __fastpackwithoutmask59(in,out);
    return;
  case 0x3c:
    __fastpackwithoutmask60(in,out);
    return;
  case 0x3d:
    __fastpackwithoutmask61(in,out);
    return;
  case 0x3e:
    __fastpackwithoutmask62(in,out);
    return;
  case 0x3f:
    __fastpackwithoutmask63(in,out);
    return;
  case 0x40:
    __fastpackwithoutmask64(in,out);
    return;
  default:
    return;
  }
}

Assistant:

inline void fastpackwithoutmask(const uint64_t *__restrict__ in,
                                uint32_t *__restrict__ out,
                                const uint32_t bit) {
  switch (bit) {
  case 0:
    __fastpackwithoutmask0(in, out);
    break;
  case 1:
    __fastpackwithoutmask1(in, out);
    break;
  case 2:
    __fastpackwithoutmask2(in, out);
    break;
  case 3:
    __fastpackwithoutmask3(in, out);
    break;
  case 4:
    __fastpackwithoutmask4(in, out);
    break;
  case 5:
    __fastpackwithoutmask5(in, out);
    break;
  case 6:
    __fastpackwithoutmask6(in, out);
    break;
  case 7:
    __fastpackwithoutmask7(in, out);
    break;
  case 8:
    __fastpackwithoutmask8(in, out);
    break;
  case 9:
    __fastpackwithoutmask9(in, out);
    break;
  case 10:
    __fastpackwithoutmask10(in, out);
    break;
  case 11:
    __fastpackwithoutmask11(in, out);
    break;
  case 12:
    __fastpackwithoutmask12(in, out);
    break;
  case 13:
    __fastpackwithoutmask13(in, out);
    break;
  case 14:
    __fastpackwithoutmask14(in, out);
    break;
  case 15:
    __fastpackwithoutmask15(in, out);
    break;
  case 16:
    __fastpackwithoutmask16(in, out);
    break;
  case 17:
    __fastpackwithoutmask17(in, out);
    break;
  case 18:
    __fastpackwithoutmask18(in, out);
    break;
  case 19:
    __fastpackwithoutmask19(in, out);
    break;
  case 20:
    __fastpackwithoutmask20(in, out);
    break;
  case 21:
    __fastpackwithoutmask21(in, out);
    break;
  case 22:
    __fastpackwithoutmask22(in, out);
    break;
  case 23:
    __fastpackwithoutmask23(in, out);
    break;
  case 24:
    __fastpackwithoutmask24(in, out);
    break;
  case 25:
    __fastpackwithoutmask25(in, out);
    break;
  case 26:
    __fastpackwithoutmask26(in, out);
    break;
  case 27:
    __fastpackwithoutmask27(in, out);
    break;
  case 28:
    __fastpackwithoutmask28(in, out);
    break;
  case 29:
    __fastpackwithoutmask29(in, out);
    break;
  case 30:
    __fastpackwithoutmask30(in, out);
    break;
  case 31:
    __fastpackwithoutmask31(in, out);
    break;
  case 32:
    __fastpackwithoutmask32(in, out);
    break;
  case 33:
    __fastpackwithoutmask33(in, out);
    break;
  case 34:
    __fastpackwithoutmask34(in, out);
    break;
  case 35:
    __fastpackwithoutmask35(in, out);
    break;
  case 36:
    __fastpackwithoutmask36(in, out);
    break;
  case 37:
    __fastpackwithoutmask37(in, out);
    break;
  case 38:
    __fastpackwithoutmask38(in, out);
    break;
  case 39:
    __fastpackwithoutmask39(in, out);
    break;
  case 40:
    __fastpackwithoutmask40(in, out);
    break;
  case 41:
    __fastpackwithoutmask41(in, out);
    break;
  case 42:
    __fastpackwithoutmask42(in, out);
    break;
  case 43:
    __fastpackwithoutmask43(in, out);
    break;
  case 44:
    __fastpackwithoutmask44(in, out);
    break;
  case 45:
    __fastpackwithoutmask45(in, out);
    break;
  case 46:
    __fastpackwithoutmask46(in, out);
    break;
  case 47:
    __fastpackwithoutmask47(in, out);
    break;
  case 48:
    __fastpackwithoutmask48(in, out);
    break;
  case 49:
    __fastpackwithoutmask49(in, out);
    break;
  case 50:
    __fastpackwithoutmask50(in, out);
    break;
  case 51:
    __fastpackwithoutmask51(in, out);
    break;
  case 52:
    __fastpackwithoutmask52(in, out);
    break;
  case 53:
    __fastpackwithoutmask53(in, out);
    break;
  case 54:
    __fastpackwithoutmask54(in, out);
    break;
  case 55:
    __fastpackwithoutmask55(in, out);
    break;
  case 56:
    __fastpackwithoutmask56(in, out);
    break;
  case 57:
    __fastpackwithoutmask57(in, out);
    break;
  case 58:
    __fastpackwithoutmask58(in, out);
    break;
  case 59:
    __fastpackwithoutmask59(in, out);
    break;
  case 60:
    __fastpackwithoutmask60(in, out);
    break;
  case 61:
    __fastpackwithoutmask61(in, out);
    break;
  case 62:
    __fastpackwithoutmask62(in, out);
    break;
  case 63:
    __fastpackwithoutmask63(in, out);
    break;
  case 64:
    __fastpackwithoutmask64(in, out);
    break;
  default:
    break;
  }
}